

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fusestrref(ASMState *as,IRIns *ir,RegSet allow)

{
  Reg RVar1;
  Reg r_1;
  Reg r;
  IRIns *irr;
  RegSet allow_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  (as->mrm).idx = 0x80;
  (as->mrm).base = 0x80;
  (as->mrm).scale = '\0';
  (as->mrm).ofs = 0x18;
  RVar1 = ra_alloc1(as,(uint)(ir->field_0).op1,allow);
  (as->mrm).base = (byte)RVar1;
  if ((ir->field_0).op2 < 0x8000) {
    (as->mrm).ofs = as->ir[(ir->field_0).op2].field_1.op12 + (as->mrm).ofs;
  }
  else {
    RVar1 = ra_alloc1(as,(uint)(ir->field_0).op2,(1 << ((byte)RVar1 & 0x1f) ^ 0xffffffffU) & allow);
    if ((as->mrm).base == 0x80) {
      (as->mrm).base = (uint8_t)RVar1;
    }
    else {
      (as->mrm).idx = (uint8_t)RVar1;
    }
  }
  return;
}

Assistant:

static void asm_fusestrref(ASMState *as, IRIns *ir, RegSet allow)
{
  IRIns *irr;
  lj_assertA(ir->o == IR_STRREF, "bad IR op %d", ir->o);
  as->mrm.base = as->mrm.idx = RID_NONE;
  as->mrm.scale = XM_SCALE1;
  as->mrm.ofs = sizeof(GCstr);
  if (!LJ_GC64 && irref_isk(ir->op1)) {
    as->mrm.ofs += IR(ir->op1)->i;
  } else {
    Reg r = ra_alloc1(as, ir->op1, allow);
    rset_clear(allow, r);
    as->mrm.base = (uint8_t)r;
  }
  irr = IR(ir->op2);
  if (irref_isk(ir->op2)) {
    as->mrm.ofs += irr->i;
  } else {
    Reg r;
    /* Fuse a constant add into the offset, e.g. string.sub(s, i+10). */
    if (!LJ_64 &&  /* Has bad effects with negative index on x64. */
	mayfuse(as, ir->op2) && irr->o == IR_ADD && irref_isk(irr->op2)) {
      as->mrm.ofs += IR(irr->op2)->i;
      r = ra_alloc1(as, irr->op1, allow);
    } else {
      r = ra_alloc1(as, ir->op2, allow);
    }
    if (as->mrm.base == RID_NONE)
      as->mrm.base = (uint8_t)r;
    else
      as->mrm.idx = (uint8_t)r;
  }
}